

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformationImplementation::RunProcess_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *args)

{
  int iVar1;
  cmsysProcess *cp;
  reference command;
  char *pcVar2;
  ostream *poVar3;
  reference ppcVar4;
  int local_68;
  int result;
  int pipe;
  double timeout;
  char *pcStack_50;
  int length;
  char *data;
  cmsysProcess *local_40;
  cmsysProcess *gp;
  allocator local_22;
  undefined1 local_21;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_20;
  vector<const_char_*,_std::allocator<const_char_*>_> *args_local;
  SystemInformationImplementation *this_local;
  string *buffer;
  
  local_21 = 0;
  local_20 = args;
  args_local = (vector<const_char_*,_std::allocator<const_char_*>_> *)this;
  this_local = (SystemInformationImplementation *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  cp = cmsysProcess_New();
  local_40 = cp;
  data = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(args);
  command = __gnu_cxx::
            __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
            ::operator*((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                         *)&data);
  cmsysProcess_SetCommand(cp,command);
  cmsysProcess_SetOption(local_40,0,1);
  cmsysProcess_Execute(local_40);
  pcStack_50 = (char *)0x0;
  _result = 255.0;
  while (iVar1 = cmsysProcess_WaitForData
                           (local_40,&stack0xffffffffffffffb0,(int *)((long)&timeout + 4),
                            (double *)&result), iVar1 == 2 || iVar1 == 3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcStack_50);
  }
  cmsysProcess_WaitForExit(local_40,(double *)0x0);
  local_68 = 0;
  iVar1 = cmsysProcess_GetState(local_40);
  switch(iVar1) {
  case 0:
  case 3:
  case 5:
  case 6:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unexpected ending state after running ");
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](args,0);
    poVar3 = std::operator<<(poVar3,*ppcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    break;
  case 1:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: Could not run ");
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](args,0);
    poVar3 = std::operator<<(poVar3,*ppcVar4);
    std::operator<<(poVar3,":\n");
    pcVar2 = cmsysProcess_GetErrorString(local_40);
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    std::operator<<(poVar3,"\n");
    break;
  case 2:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: ");
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](args,0);
    poVar3 = std::operator<<(poVar3,*ppcVar4);
    poVar3 = std::operator<<(poVar3," terminated with an exception: ");
    pcVar2 = cmsysProcess_GetExceptionString(local_40);
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3,"\n");
    break;
  case 4:
    local_68 = cmsysProcess_GetExitValue(local_40);
  }
  cmsysProcess_Delete(local_40);
  if (local_68 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](args,0);
    poVar3 = std::operator<<(poVar3,*ppcVar4);
    poVar3 = std::operator<<(poVar3," returned :");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_68);
    std::operator<<(poVar3,"\n");
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemInformationImplementation::RunProcess(kwsys_stl::vector<const char*> args)
{
  kwsys_stl::string buffer = "";

  // Run the application
  kwsysProcess* gp = kwsysProcess_New();
  kwsysProcess_SetCommand(gp, &*args.begin());
  kwsysProcess_SetOption(gp,kwsysProcess_Option_HideWindow,1);

  kwsysProcess_Execute(gp);

  char* data = NULL;
  int length;
  double timeout = 255;
  int pipe; // pipe id as returned by kwsysProcess_WaitForData()

  while( ( pipe = kwsysProcess_WaitForData(gp,&data,&length,&timeout),
           (pipe == kwsysProcess_Pipe_STDOUT || pipe == kwsysProcess_Pipe_STDERR) ) ) // wait for 1s
    {
      buffer.append(data, length);
    }
  kwsysProcess_WaitForExit(gp, 0);

  int result = 0;
  switch(kwsysProcess_GetState(gp))
    {
    case kwsysProcess_State_Exited:
      {
      result = kwsysProcess_GetExitValue(gp);
      } break;
    case kwsysProcess_State_Error:
      {
      kwsys_ios::cerr << "Error: Could not run " << args[0] << ":\n";
      kwsys_ios::cerr << kwsysProcess_GetErrorString(gp) << "\n";
      } break;
    case kwsysProcess_State_Exception:
      {
      kwsys_ios::cerr << "Error: " << args[0]
                << " terminated with an exception: "
                << kwsysProcess_GetExceptionString(gp) << "\n";
      } break;
    case kwsysProcess_State_Starting:
    case kwsysProcess_State_Executing:
    case kwsysProcess_State_Expired:
    case kwsysProcess_State_Killed:
      {
      // Should not get here.
      kwsys_ios::cerr << "Unexpected ending state after running " << args[0]
                << kwsys_ios::endl;
      } break;
    }
  kwsysProcess_Delete(gp);
  if(result)
    {
    kwsys_ios::cerr << "Error " << args[0] << " returned :" << result << "\n";
    }
  return buffer;
}